

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O3

void __thiscall Image_CopyRectOut_Test::TestBody(Image_CopyRectOut_Test *this)

{
  pointer pbVar1;
  bool bVar2;
  Allocator alloc;
  int iVar3;
  int iVar4;
  Point2i p;
  float *pfVar5;
  int c;
  uint uVar6;
  char *message;
  Tuple2<pbrt::Point2,_int> p_00;
  Tuple2<pbrt::Point2,_int> TVar7;
  uint nc;
  long lVar8;
  int x;
  ulong uVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<float> buf_00;
  AssertionResult gtest_ar_;
  Bounds2i extent;
  AssertionResult gtest_ar;
  vector<float,_std::allocator<float>_> buf;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> orig;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  channelNames;
  Image image;
  AssertHelper local_220;
  Message local_218;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  Bounds2i local_208;
  long local_1f8;
  Tuple2<pbrt::Point2,_int> local_1f0;
  PixelFormat local_1e4;
  string local_1e0;
  vector<float,_std::allocator<float>_> local_1c0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_1a8;
  long local_188;
  AssertHelper local_180;
  ColorEncodingHandle local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  PixelFormat local_154 [3];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_148 [2];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  polymorphic_allocator<unsigned_char> local_90;
  uchar *local_88;
  size_t local_80;
  size_t local_78;
  polymorphic_allocator<pbrt::Half> local_70;
  Half *local_68;
  size_t local_60;
  size_t local_58;
  polymorphic_allocator<float> local_50;
  float *local_48;
  size_t local_40;
  size_t local_38;
  
  local_1f8 = 0;
  local_154[0] = U256;
  local_154[1] = Half;
  local_154[2] = 2;
  do {
    iVar4 = 0;
    nc = 1;
    local_1e4 = *(PixelFormat *)((long)local_154 + local_1f8);
    do {
      GetFloatPixels(&local_1a8,(Point2i)0xe0000001d,nc);
      local_148[0] = &local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"A","");
      __l._M_len = 1;
      __l._M_array = (iterator)local_148;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_170,__l,(allocator_type *)&local_1e0);
      if (local_148[0] != &local_138) {
        operator_delete(local_148[0],
                        (ulong)((long)&(local_138.alloc.memoryResource)->_vptr_memory_resource + 1))
        ;
      }
      iVar3 = iVar4;
      if (1 < nc) {
        do {
          local_148[0] = &local_138;
          std::__cxx11::string::_M_construct((ulong)local_148,'\x01');
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_170
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148
                    );
          if (local_148[0] != &local_138) {
            operator_delete(local_148[0],
                            (ulong)((long)&(local_138.alloc.memoryResource)->_vptr_memory_resource +
                                   1));
          }
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      pbVar1 = local_170.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = (long)local_170.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_170.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_178.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )pbrt::ColorEncodingHandle::Linear.bits;
      alloc.memoryResource = pstd::pmr::new_delete_resource();
      channels.n = lVar8 >> 5;
      channels.ptr = pbVar1;
      pbrt::Image::Image((Image *)local_148,local_1e4,(Point2i)0xe0000001d,channels,&local_178,alloc
                        );
      lVar8 = 0;
      pfVar5 = local_1a8.ptr;
      do {
        local_1f0 = (Tuple2<pbrt::Point2,_int>)(lVar8 << 0x20);
        uVar9 = 0;
        local_188 = lVar8;
        do {
          uVar6 = 0;
          p.super_Tuple2<pbrt::Point2,_int> = local_1f0 | uVar9;
          do {
            pbrt::Image::SetChannel((Image *)local_148,p,uVar6,*pfVar5);
            uVar6 = uVar6 + 1;
            pfVar5 = pfVar5 + 1;
          } while (nc != uVar6);
          uVar9 = uVar9 + 1;
        } while (uVar9 != 0x1d);
        lVar8 = local_188 + 1;
      } while (lVar8 != 0xe);
      local_208.pMin.super_Tuple2<pbrt::Point2,_int>.x = 2;
      local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y = 3;
      local_208.pMax.super_Tuple2<pbrt::Point2,_int>.x = 5;
      local_208.pMax.super_Tuple2<pbrt::Point2,_int>.y = 10;
      std::vector<float,_std::allocator<float>_>::vector
                (&local_1c0,(long)(int)(nc * 0x15),(allocator_type *)&local_1e0);
      buf_00.n = (long)local_1c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_1c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2;
      buf_00.ptr = local_1c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
      pbrt::Image::CopyRectOut((Image *)local_148,&local_208,buf_00,(WrapMode2D)0x200000002);
      bVar2 = true;
      if ((local_208.pMin.super_Tuple2<pbrt::Point2,_int>.x <
           local_208.pMax.super_Tuple2<pbrt::Point2,_int>.x) &&
         (pfVar5 = local_1c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start,
         p_00 = local_208.pMin.super_Tuple2<pbrt::Point2,_int>,
         local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y <
         local_208.pMax.super_Tuple2<pbrt::Point2,_int>.y)) {
        do {
          uVar6 = 0;
          TVar7 = p_00;
          local_1f0 = p_00;
          do {
            local_218.ss_.ptr_._0_4_ =
                 (Float)CONCAT31(local_218.ss_.ptr_._1_3_,
                                 pfVar5 != local_1c0.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_finish);
            local_210.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (pfVar5 == local_1c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish) {
              testing::Message::Message((Message *)&local_220);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_1e0,(internal *)&local_218,(AssertionResult *)"bufIter == buf.end()"
                         ,"true","false",(char *)TVar7);
              testing::internal::AssertHelper::AssertHelper
                        (&local_180,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0xf9,(char *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,
                                                (char)local_1e0._M_dataplus._M_p));
              testing::internal::AssertHelper::operator=(&local_180,(Message *)&local_220);
              testing::internal::AssertHelper::~AssertHelper(&local_180);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_1e0._M_dataplus._M_p._1_7_,(char)local_1e0._M_dataplus._M_p) !=
                  &local_1e0.field_2) {
                operator_delete((undefined1 *)
                                CONCAT71(local_1e0._M_dataplus._M_p._1_7_,
                                         (char)local_1e0._M_dataplus._M_p),
                                local_1e0.field_2._M_allocated_capacity + 1);
              }
              if (((local_220.data_ != (AssertHelperData *)0x0) &&
                  (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
                 (local_220.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_220.data_ + 8))();
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_210,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              bVar2 = false;
              goto LAB_0030b052;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_210,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_218.ss_.ptr_._0_4_ =
                 pbrt::Image::GetChannel
                           ((Image *)local_148,(Point2i)p_00,uVar6,(WrapMode2D)0x200000002);
            testing::internal::CmpHelperEQ<float,float>
                      ((internal *)&local_1e0,"*bufIter","image.GetChannel(*pIter, c)",pfVar5,
                       (float *)&local_218);
            if ((char)local_1e0._M_dataplus._M_p == '\0') {
              testing::Message::Message(&local_218);
              message = "";
              if ((undefined8 *)local_1e0._M_string_length != (undefined8 *)0x0) {
                message = *(char **)local_1e0._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_220,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                         ,0xfa,message);
              testing::internal::AssertHelper::operator=(&local_220,&local_218);
              testing::internal::AssertHelper::~AssertHelper(&local_220);
              if (((CONCAT44(local_218.ss_.ptr_._4_4_,local_218.ss_.ptr_._0_4_) != 0) &&
                  (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
                 ((long *)CONCAT44(local_218.ss_.ptr_._4_4_,local_218.ss_.ptr_._0_4_) != (long *)0x0
                 )) {
                (**(code **)(*(long *)CONCAT44(local_218.ss_.ptr_._4_4_,local_218.ss_.ptr_._0_4_) +
                            8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_1e0._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            pfVar5 = pfVar5 + 1;
            uVar6 = uVar6 + 1;
          } while (nc != uVar6);
          uVar6 = local_1f0.x + 1;
          TVar7 = (Tuple2<pbrt::Point2,_int>)
                  (((ulong)p_00 & 0xffffffff00000000 |
                   (ulong)local_208.pMin.super_Tuple2<pbrt::Point2,_int> & 0xffffffff) + 0x100000000
                  );
          if (uVar6 != local_208.pMax.super_Tuple2<pbrt::Point2,_int>.x) {
            TVar7 = (Tuple2<pbrt::Point2,_int>)(((ulong)p_00 & 0xffffffff00000000) + (ulong)uVar6);
          }
          iVar3 = local_208.pMax.super_Tuple2<pbrt::Point2,_int>.y;
          if (local_208.pMax.super_Tuple2<pbrt::Point2,_int>.x <=
              local_208.pMin.super_Tuple2<pbrt::Point2,_int>.x ||
              local_208.pMax.super_Tuple2<pbrt::Point2,_int>.y <=
              local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y) {
            iVar3 = local_208.pMin.super_Tuple2<pbrt::Point2,_int>.y;
          }
          p_00 = TVar7;
        } while ((local_208.pMin.super_Tuple2<pbrt::Point2,_int>.x != TVar7.x) || (iVar3 != TVar7.y)
                );
        bVar2 = true;
      }
LAB_0030b052:
      if (local_1c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (float *)0x0) {
        operator_delete(local_1c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_38 = 0;
      (*(local_50.memoryResource)->_vptr_memory_resource[3])
                (local_50.memoryResource,local_48,local_40 << 2,4);
      local_58 = 0;
      (*(local_70.memoryResource)->_vptr_memory_resource[3])
                (local_70.memoryResource,local_68,local_60 * 2,2);
      local_78 = 0;
      (*(local_90.memoryResource)->_vptr_memory_resource[3])
                (local_90.memoryResource,local_88,local_80,1);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector(&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_170);
      local_1a8.nStored = 0;
      (*(local_1a8.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_1a8.alloc.memoryResource,local_1a8.ptr,local_1a8.nAlloc << 2,4);
      if (!bVar2) {
        return;
      }
      nc = nc + 1;
      iVar4 = iVar4 + 1;
    } while (nc != 4);
    local_1f8 = local_1f8 + 4;
    if (local_1f8 == 0xc) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Image, CopyRectOut) {
    Point2i res(29, 14);

    for (auto format : {PixelFormat::U256, PixelFormat::Half, PixelFormat::Float}) {
        // for (int nc : { 1, 3 }) {
        for (int nc = 1; nc < 4; ++nc) {
            pstd::vector<float> orig = GetFloatPixels(res, nc);

            std::vector<std::string> channelNames = {"A"};
            for (int i = 1; i < nc; ++i)
                channelNames.push_back(std::string(1, 'A' + 1));

            Image image(format, res, channelNames, ColorEncodingHandle::Linear);

            auto origIter = orig.begin();
            for (int y = 0; y < res[1]; ++y)
                for (int x = 0; x < res[0]; ++x)
                    for (int c = 0; c < nc; ++c, ++origIter)
                        image.SetChannel({x, y}, c, *origIter);

            Bounds2i extent(Point2i(2, 3), Point2i(5, 10));
            std::vector<float> buf(extent.Area() * nc);

            image.CopyRectOut(extent, pstd::MakeSpan(buf));

            // Iterate through the points in the extent and the buffer
            // together.
            auto bufIter = buf.begin();
            for (auto pIter = begin(extent); pIter != end(extent); ++pIter) {
                for (int c = 0; c < nc; ++c) {
                    ASSERT_FALSE(bufIter == buf.end());
                    EXPECT_EQ(*bufIter, image.GetChannel(*pIter, c));
                    ++bufIter;
                }
            }
        }
    }
}